

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizard::removePage(QWizard *this,int id)

{
  PageMap *this_00;
  long lVar1;
  int *piVar2;
  _Rb_tree_color _Var3;
  QWizardPrivate *this_01;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar4;
  QWizardPrivate *this_02;
  QWizardField *pQVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  QWidget *widget;
  void **in_RCX;
  _Base_ptr p_Var9;
  void **ppvVar10;
  QList<QWizardField> *this_03;
  ulong uVar11;
  long in_FS_OFFSET;
  int local_50;
  int local_4c;
  void *local_48;
  int *piStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_00 = &this_01->pageMap;
  pQVar4 = (this_01->pageMap).d.d.ptr;
  local_50 = id;
  if (((pQVar4 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) &&
      (0 < (long)(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
     (this_01->start == id)) {
    _Var3 = (*(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10))
            [1]._M_color;
    in_RCX = (void **)(ulong)_Var3;
    if ((_Var3 == id) &&
       (in_RCX = (void **)0xffffffff,
       1 < (long)(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
      if (pQVar4 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                     *)0x0) {
        p_Var9 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var9 = *(_Base_ptr *)
                  ((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      lVar8 = std::_Rb_tree_increment(p_Var9);
      in_RCX = (void **)(ulong)*(uint *)(lVar8 + 0x20);
    }
    this_01->start = (int)in_RCX;
    this_01->startSetByUser = false;
  }
  bVar6 = QMap<int,_QWizardPage_*>::contains(this_00,&local_50);
  if (bVar6) {
    piStack_40 = &local_4c;
    local_4c = local_50;
    in_RCX = &local_48;
    local_48 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,in_RCX);
  }
  lVar8 = (this_01->history).d.size;
  if (lVar8 == 0) {
LAB_00517636:
    in_RCX = (void **)0xffffffffffffffff;
  }
  else {
    ppvVar10 = (void **)0xfffffffffffffffc;
    do {
      lVar1 = lVar8 * -4 + (long)ppvVar10;
      if (lVar1 == -4) goto LAB_00517630;
      in_RCX = (void **)((long)ppvVar10 + 4);
      piVar2 = (int *)((long)((this_01->history).d.ptr + 1) + (long)ppvVar10);
      ppvVar10 = in_RCX;
    } while (*piVar2 != local_50);
    in_RCX = (void **)((long)in_RCX >> 2);
LAB_00517630:
    if (lVar1 == -4) goto LAB_00517636;
  }
  if (in_RCX == (void **)0xffffffffffffffff) {
LAB_005176df:
    widget = &QMap<int,_QWizardPage_*>::take(this_00,&local_50)->super_QWidget;
  }
  else {
    if (local_50 != this_01->current) {
      widget = &QMap<int,_QWizardPage_*>::take(this_00,&local_50)->super_QWidget;
      QtPrivate::sequential_erase_one<QList<int>,int>(&this_01->history,&local_50);
      QWizardPrivate::_q_updateButtonStates(this_01);
      goto LAB_005176f7;
    }
    if (lVar8 != 1) {
      this_02 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
      uVar7 = (int)(this_02->history).d.size - 2;
      if (-1 < (int)uVar7) {
        QWizardPrivate::switchToPage(this_02,(this_02->history).d.ptr[uVar7],Backward);
      }
      goto LAB_005176df;
    }
    QWizardPrivate::reset(this_01);
    widget = &QMap<int,_QWizardPage_*>::take(this_00,&local_50)->super_QWidget;
    pQVar4 = (this_01->pageMap).d.d.ptr;
    if ((pQVar4 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                    *)0x0) && ((pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      restart(this);
      goto LAB_005176f7;
    }
  }
  QWizardPrivate::updateCurrentPage(this_01);
LAB_005176f7:
  if (widget != (QWidget *)0x0) {
    if (*(char *)(*(long *)&widget->field_0x8 + 0x30e) == '\x01') {
      (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1e0))(this,local_50);
      *(undefined1 *)(*(long *)&widget->field_0x8 + 0x30e) = 0;
    }
    QLayout::removeWidget((QLayout *)this_01->pageVBoxLayout,widget);
    uVar7 = (int)(this_01->fields).d.size - 1;
    if (-1 < (int)uVar7) {
      lVar8 = (ulong)uVar7 << 7;
      uVar11 = (ulong)uVar7;
      do {
        pQVar5 = (this_01->fields).d.ptr;
        if (*(QWidget **)((long)&pQVar5->page + lVar8) == widget) {
          this_03 = (QList<QWizardField> *)(*(long *)&widget->field_0x8 + 0x2f0);
          QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
                    ((QMovableArrayOps<QWizardField> *)this_03,
                     *(qsizetype *)(*(long *)&widget->field_0x8 + 0x300),
                     (QWizardField *)((long)&pQVar5->page + lVar8));
          QList<QWizardField>::end(this_03);
          QWizardPrivate::removeFieldAt(this_01,(int)uVar11);
        }
        lVar8 = lVar8 + -0x80;
        bVar6 = 0 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::removePage(int id)
{
    Q_D(QWizard);

    QWizardPage *removedPage = nullptr;

    // update startItem accordingly
    if (d->pageMap.size() > 0) { // only if we have any pages
        if (d->start == id) {
            const int firstId = d->pageMap.constBegin().key();
            if (firstId == id) {
                if (d->pageMap.size() > 1)
                    d->start = (++d->pageMap.constBegin()).key(); // secondId
                else
                    d->start = -1; // removing the last page
            } else { // startSetByUser has to be "true" here
                d->start = firstId;
            }
            d->startSetByUser = false;
        }
    }

    if (d->pageMap.contains(id))
        emit pageRemoved(id);

    if (!d->history.contains(id)) {
        // Case 1: removing a page not in the history
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    } else if (id != d->current) {
        // Case 2: removing a page in the history before the current page
        removedPage = d->pageMap.take(id);
        d->history.removeOne(id);
        d->_q_updateButtonStates();
    } else if (d->history.size() == 1) {
        // Case 3: removing the current page which is the first (and only) one in the history
        d->reset();
        removedPage = d->pageMap.take(id);
        if (d->pageMap.isEmpty())
            d->updateCurrentPage();
        else
            restart();
    } else {
        // Case 4: removing the current page which is not the first one in the history
        back();
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    }

    if (removedPage) {
        if (removedPage->d_func()->initialized) {
            cleanupPage(id);
            removedPage->d_func()->initialized = false;
        }

        d->pageVBoxLayout->removeWidget(removedPage);

        for (int i = d->fields.size() - 1; i >= 0; --i) {
            if (d->fields.at(i).page == removedPage) {
                removedPage->d_func()->pendingFields += d->fields.at(i);
                d->removeFieldAt(i);
            }
        }
    }
}